

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall
jessilib::config::load(config *this,path *in_filename,string *in_format,text_encoding in_encoding)

{
  bool bVar1;
  object local_a8;
  string local_60;
  lock_guard<std::shared_mutex> local_30;
  lock_guard<std::shared_mutex> guard;
  text_encoding in_encoding_local;
  string *in_format_local;
  path *in_filename_local;
  config *this_local;
  
  guard._M_device._4_4_ = in_encoding;
  bVar1 = std::filesystem::__cxx11::path::empty(in_filename);
  impl::_assert_helper
            (!bVar1,
             "Failed assertion: \'!in_filename.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:69"
            );
  std::lock_guard<std::shared_mutex>::lock_guard(&local_30,&this->m_mutex);
  std::filesystem::__cxx11::path::operator=(&this->m_filename,in_filename);
  get_format(&local_60,&this->m_filename,in_format);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_format,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  this->m_encoding = guard._M_device._4_4_;
  read_object(&local_a8,&this->m_filename,&this->m_format,this->m_encoding);
  object::operator=(&this->m_data,&local_a8);
  object::~object(&local_a8);
  std::lock_guard<std::shared_mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void config::load(const std::filesystem::path& in_filename, const std::string& in_format, text_encoding in_encoding) {
	jessilib_assert(!in_filename.empty());
	std::lock_guard<std::shared_mutex> guard{ m_mutex };

	// Determine format
	m_filename = in_filename;
	m_format = get_format(m_filename, in_format);
	m_encoding = in_encoding;

	// Load
	m_data = read_object(m_filename, m_format, m_encoding);
}